

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_islow(DCTELEM *data)

{
  short sVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  short *in_RDI;
  JLONG tmp2;
  JLONG tmp1;
  JLONG tmp0;
  int local_9c;
  short *local_98;
  int ctr;
  DCTELEM *dataptr;
  JLONG z5;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  JLONG tmp7;
  JLONG tmp6;
  JLONG tmp5;
  JLONG tmp4;
  JLONG tmp3;
  
  local_98 = in_RDI;
  for (local_9c = 7; -1 < local_9c; local_9c = local_9c + -1) {
    lVar3 = (long)((int)*local_98 - (int)local_98[7]);
    lVar4 = (long)((int)local_98[1] - (int)local_98[6]);
    lVar5 = (long)((int)local_98[2] - (int)local_98[5]);
    lVar6 = (long)((int)local_98[3] - (int)local_98[4]);
    sVar1 = (short)((int)*local_98 + (int)local_98[7]) +
            (short)((int)local_98[3] + (int)local_98[4]);
    lVar7 = (long)((int)*local_98 + (int)local_98[7]) - (long)((int)local_98[3] + (int)local_98[4]);
    sVar2 = (short)((int)local_98[1] + (int)local_98[6]) +
            (short)((int)local_98[2] + (int)local_98[5]);
    lVar8 = (long)((int)local_98[1] + (int)local_98[6]) -
            (long)((int)local_98[2] + (int)local_98[5]);
    *local_98 = (sVar1 + sVar2) * 4;
    local_98[4] = (sVar1 - sVar2) * 4;
    lVar9 = (lVar8 + lVar7) * 0x1151;
    local_98[2] = (short)(lVar9 + lVar7 * 0x187e + 0x400 >> 0xb);
    local_98[6] = (short)(lVar9 + lVar8 * -0x3b21 + 0x400 >> 0xb);
    lVar10 = (lVar6 + lVar4 + lVar5 + lVar3) * 0x25a1;
    lVar7 = (lVar6 + lVar3) * -0x1ccd;
    lVar8 = (lVar5 + lVar4) * -0x5203;
    lVar9 = lVar10 + (lVar6 + lVar4) * -0x3ec5;
    lVar10 = lVar10 + (lVar5 + lVar3) * -0xc7c;
    local_98[7] = (short)(lVar6 * 0x98e + lVar7 + lVar9 + 0x400 >> 0xb);
    local_98[5] = (short)(lVar5 * 0x41b3 + lVar8 + lVar10 + 0x400 >> 0xb);
    local_98[3] = (short)(lVar4 * 0x6254 + lVar8 + lVar9 + 0x400 >> 0xb);
    local_98[1] = (short)(lVar3 * 0x300b + lVar7 + lVar10 + 0x400 >> 0xb);
    local_98 = local_98 + 8;
  }
  local_98 = in_RDI;
  for (local_9c = 7; -1 < local_9c; local_9c = local_9c + -1) {
    lVar3 = (long)((int)*local_98 - (int)local_98[0x38]);
    lVar4 = (long)((int)local_98[8] - (int)local_98[0x30]);
    lVar5 = (long)((int)local_98[0x10] - (int)local_98[0x28]);
    lVar6 = (long)((int)local_98[0x18] - (int)local_98[0x20]);
    lVar7 = (long)((int)*local_98 + (int)local_98[0x38]) +
            (long)((int)local_98[0x18] + (int)local_98[0x20]);
    lVar8 = (long)((int)*local_98 + (int)local_98[0x38]) -
            (long)((int)local_98[0x18] + (int)local_98[0x20]);
    lVar9 = (long)((int)local_98[8] + (int)local_98[0x30]) +
            (long)((int)local_98[0x10] + (int)local_98[0x28]);
    lVar10 = (long)((int)local_98[8] + (int)local_98[0x30]) -
             (long)((int)local_98[0x10] + (int)local_98[0x28]);
    *local_98 = (short)(lVar7 + lVar9 + 2 >> 2);
    local_98[0x20] = (short)((lVar7 - lVar9) + 2 >> 2);
    lVar7 = (lVar10 + lVar8) * 0x1151;
    local_98[0x10] = (short)(lVar7 + lVar8 * 0x187e + 0x4000 >> 0xf);
    local_98[0x30] = (short)(lVar7 + lVar10 * -0x3b21 + 0x4000 >> 0xf);
    lVar10 = (lVar6 + lVar4 + lVar5 + lVar3) * 0x25a1;
    lVar7 = (lVar6 + lVar3) * -0x1ccd;
    lVar8 = (lVar5 + lVar4) * -0x5203;
    lVar9 = lVar10 + (lVar6 + lVar4) * -0x3ec5;
    lVar10 = lVar10 + (lVar5 + lVar3) * -0xc7c;
    local_98[0x38] = (short)(lVar6 * 0x98e + lVar7 + lVar9 + 0x4000 >> 0xf);
    local_98[0x28] = (short)(lVar5 * 0x41b3 + lVar8 + lVar10 + 0x4000 >> 0xf);
    local_98[0x18] = (short)(lVar4 * 0x6254 + lVar8 + lVar9 + 0x4000 >> 0xf);
    local_98[8] = (short)(lVar3 * 0x300b + lVar7 + lVar10 + 0x4000 >> 0xf);
    local_98 = local_98 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_islow(DCTELEM *data)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  JLONG tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3, z4, z5;
  DCTELEM *dataptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = (DCTELEM)LEFT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[4] = (DCTELEM)LEFT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[2] = (DCTELEM)DESCALE(z1 + MULTIPLY(tmp13, FIX_0_765366865),
                                  CONST_BITS - PASS1_BITS);
    dataptr[6] = (DCTELEM)DESCALE(z1 + MULTIPLY(tmp12, -FIX_1_847759065),
                                  CONST_BITS - PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents cos(K*pi/16).
     * i0..i3 in the paper are tmp4..tmp7 here.
     */

    z1 = tmp4 + tmp7;
    z2 = tmp5 + tmp6;
    z3 = tmp4 + tmp6;
    z4 = tmp5 + tmp7;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp4 = MULTIPLY(tmp4, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp5 = MULTIPLY(tmp5, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp6 = MULTIPLY(tmp6, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp7 = MULTIPLY(tmp7, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    dataptr[7] = (DCTELEM)DESCALE(tmp4 + z1 + z3, CONST_BITS - PASS1_BITS);
    dataptr[5] = (DCTELEM)DESCALE(tmp5 + z2 + z4, CONST_BITS - PASS1_BITS);
    dataptr[3] = (DCTELEM)DESCALE(tmp6 + z2 + z3, CONST_BITS - PASS1_BITS);
    dataptr[1] = (DCTELEM)DESCALE(tmp7 + z1 + z4, CONST_BITS - PASS1_BITS);

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = (DCTELEM)DESCALE(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE * 4] = (DCTELEM)DESCALE(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[DCTSIZE * 2] =
      (DCTELEM)DESCALE(z1 + MULTIPLY(tmp13, FIX_0_765366865),
                       CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 6] =
      (DCTELEM)DESCALE(z1 + MULTIPLY(tmp12, -FIX_1_847759065),
                       CONST_BITS + PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents cos(K*pi/16).
     * i0..i3 in the paper are tmp4..tmp7 here.
     */

    z1 = tmp4 + tmp7;
    z2 = tmp5 + tmp6;
    z3 = tmp4 + tmp6;
    z4 = tmp5 + tmp7;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp4 = MULTIPLY(tmp4, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp5 = MULTIPLY(tmp5, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp6 = MULTIPLY(tmp6, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp7 = MULTIPLY(tmp7, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    dataptr[DCTSIZE * 7] = (DCTELEM)DESCALE(tmp4 + z1 + z3,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 5] = (DCTELEM)DESCALE(tmp5 + z2 + z4,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 3] = (DCTELEM)DESCALE(tmp6 + z2 + z3,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 1] = (DCTELEM)DESCALE(tmp7 + z1 + z4,
                                            CONST_BITS + PASS1_BITS);

    dataptr++;                  /* advance pointer to next column */
  }
}